

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<15>::PartialDistribution::
PartialDistribution<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (PartialDistribution *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined4 in_register_00000084;
  int in_stack_fffffffffffffee0;
  PartialDistribution local_118;
  
  readPartialDistribution<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_118,(PartialDistribution *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)CONCAT44(in_register_00000084,MAT),MF,MT,
             in_stack_fffffffffffffee0);
  PartialDistribution(this,&local_118);
  ~PartialDistribution(&local_118);
  return;
}

Assistant:

PartialDistribution( Iterator& begin,
                     const Iterator& end,
                     long& lineNumber,
                     int MAT,
                     int MF,
                     int MT ) :
  PartialDistribution( readPartialDistribution( begin, end, lineNumber,
                                                MAT, MF, MT ) ) {}